

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

void __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::~GenericSchemaDocument
          (GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
           *this)

{
  bool bVar1;
  SchemaEntry *this_00;
  GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *this_local;
  
  while( true ) {
    bVar1 = internal::Stack<rapidjson::CrtAllocator>::Empty(&this->schemaMap_);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_00 = internal::Stack<rapidjson::CrtAllocator>::
              Pop<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>::SchemaEntry>
                        (&this->schemaMap_,1);
    SchemaEntry::~SchemaEntry(this_00);
  }
  if (this->typeless_ != (SchemaType *)0x0) {
    internal::
    Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
    ::~Schema(this->typeless_);
    CrtAllocator::Free(this->typeless_);
  }
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::SetNull(&this->uri_);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::SetNull(&this->error_);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::SetNull(&this->currentError_);
  if (this->ownAllocator_ != (CrtAllocator *)0x0) {
    operator_delete(this->ownAllocator_,1);
  }
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&this->currentError_);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&this->error_);
  Specification::~Specification(&this->spec_);
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  ::~GenericUri(&this->docId_);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&this->uri_);
  internal::Stack<rapidjson::CrtAllocator>::~Stack(&this->schemaRef_);
  internal::Stack<rapidjson::CrtAllocator>::~Stack(&this->schemaMap_);
  return;
}

Assistant:

~GenericSchemaDocument() {
        while (!schemaMap_.Empty())
            schemaMap_.template Pop<SchemaEntry>(1)->~SchemaEntry();

        if (typeless_) {
            typeless_->~SchemaType();
            Allocator::Free(typeless_);
        }

        // these may contain some allocator data so clear before deleting ownAllocator_
        uri_.SetNull();
        error_.SetNull();
        currentError_.SetNull();

        RAPIDJSON_DELETE(ownAllocator_);
    }